

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O3

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_>::
     test_vector(string *input,string *expected)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  size_type sVar1;
  int iVar2;
  undefined1 **last;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>_> digester;
  string local_100;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  string *local_c0;
  string *local_b8;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  shared_count sStack_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  string **local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  string **local_30;
  
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  ::evp_message_digest_context
            (&digester.
              super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
            );
  first._M_current = (input->_M_dataplus)._M_p;
  sVar1 = input->_M_string_length;
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  ::reset(&digester.
           super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
         );
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,0ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
  ::update<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,0ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
              *)&digester,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(first._M_current + sVar1));
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,0ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
  ::finalize<unsigned_char*>
            ((evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,0ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
              *)&digester,(uchar *)0x0);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
  ;
  local_80 = "";
  last = &local_98;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x2a);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_002e0fe0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  to_hex<unsigned_char_const*>(&local_100,(cryptox *)0x0,(uchar *)0x0,(uchar *)last);
  if (local_100._M_string_length == expected->_M_string_length) {
    if (local_100._M_string_length == 0) {
      local_b0[0] = true;
    }
    else {
      iVar2 = bcmp(local_100._M_dataplus._M_p,(expected->_M_dataplus)._M_p,
                   local_100._M_string_length);
      local_b0[0] = iVar2 == 0;
    }
  }
  else {
    local_b0[0] = false;
  }
  local_a8 = 0;
  sStack_a0.pi_ = (sp_counted_base *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
  ;
  local_70 = "";
  local_30 = &local_b8;
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_002e1030;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_50 = &local_c0;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_002e1030;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = expected;
  local_b8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (local_b0,&local_e0,&local_78,0x2a,1,2,2,"to_hex(actual)",&local_48,"expected",&local_68
            );
  boost::detail::shared_count::~shared_count(&sStack_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  EVP_MD_CTX_free(digester.
                  super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md_null,_0UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
                  ._context);
  return;
}

Assistant:

static void test_vector(const std::string& input,
		                        const std::string& expected) {

			typename Algorithm::digest_type actual;

			basic_message_digester<Algorithm> digester;
			digester(input.begin(), input.end(), actual.begin());

			BOOST_CHECK_EQUAL(to_hex(actual), expected);
		}